

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.h
# Opt level: O2

void __thiscall
program_options::unknown_option::unknown_option(unknown_option *this,string *original_token)

{
  allocator<char> local_39;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"unrecognised option \'%canonical_option%\'",&local_39);
  error_with_no_option_name::error_with_no_option_name
            (&this->super_error_with_no_option_name,&local_38,original_token);
  std::__cxx11::string::~string((string *)&local_38);
  *(undefined ***)&(this->super_error_with_no_option_name).super_error_with_option_name.super_error
       = &PTR__error_with_option_name_00121a40;
  return;
}

Assistant:

unknown_option(const std::string& original_token = "")
    : error_with_no_option_name("unrecognised option '%canonical_option%'", original_token)
    {
    }